

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinMd5
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  UString *in_RDX;
  allocator<char> *in_RSI;
  allocator_type *in_RDI;
  Value VVar1;
  string value;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000190;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000198;
  string *in_stack_000001a0;
  LocationRange *in_stack_000001a8;
  Interpreter *in_stack_000001b0;
  UString *in_stack_fffffffffffffea8;
  Interpreter *in_stack_fffffffffffffeb0;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_fffffffffffffec0;
  string *psVar2;
  UString *s;
  string *s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string local_f0 [24];
  string *in_stack_ffffffffffffff28;
  undefined4 uStack_ac;
  string local_a0 [36];
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  undefined1 local_39 [33];
  UString *local_18;
  
  s_00 = (string *)local_39;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffef0,(char *)s_00,in_RSI);
  local_7c = 0x13;
  local_78 = &local_7c;
  local_70 = 1;
  s = local_18;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d8c1c);
  __l._M_len = (size_type)in_stack_fffffffffffffef0;
  __l._M_array = (iterator)s_00;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_RSI,__l,in_RDI);
  validateBuiltinArgs(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
                      in_stack_00000190);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_stack_fffffffffffffec0);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d8c80);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                *)local_18,0);
  psVar2 = local_a0;
  encode_utf8(s);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffef0,psVar2);
  md5(in_stack_ffffffffffffff28);
  decode_utf8(s_00);
  VVar1 = makeString(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_ac,VVar1.t);
  ((anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48))->h = (HeapEntity *)VVar1.v;
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             VVar1.v.h);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  std::__cxx11::string::~string(local_a0);
  return (AST *)0x0;
}

Assistant:

const AST *builtinMd5(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "md5", args, {Value::STRING});

        std::string value = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        scratch = makeString(decode_utf8(md5(value)));
        return nullptr;
    }